

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluka_reader.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint *puVar1;
  ulong uVar2;
  bool bVar3;
  void *pvVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  int i;
  long lVar8;
  ulong uVar9;
  int iVar10;
  bool bVar11;
  double dVar12;
  int nbin_E;
  allocator local_a2d;
  int nbin_A;
  ulong local_a28;
  double Theta_min;
  double Delta_theta;
  double Delta_E;
  int local_a08;
  uint local_a04;
  double E_min;
  double weight;
  allocator local_9f0 [32];
  double Theta_max;
  double E_max;
  istringstream input_file;
  string local_9b0 [368];
  ifstream input1;
  byte abStack_820 [488];
  ofstream output_file;
  undefined8 auStack_630 [2];
  uint auStack_620 [2];
  byte abStack_618 [480];
  char buffer [1025];
  
  if (argc < 5) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Si usa: ./a.out  -in FILE_IN   -out FILE_OUT");
    std::endl<char,std::char_traits<char>>(poVar5);
    exit(0xff);
  }
  std::ifstream::ifstream(&input1);
  std::__cxx11::istringstream::istringstream((istringstream *)&input_file);
  std::ofstream::ofstream(&output_file);
  local_a28._0_1_ = 1;
  iVar10 = 1;
  bVar11 = true;
  do {
    if (argc <= iVar10) {
      if (!bVar11 && ((byte)local_a28 & 1) == 0) {
        leggi_bene(&input1,"total weight",buffer,&input_file);
        std::istream::ignore((long)&input_file,0x400);
        std::istream::ignore((long)&input_file,0x400);
        std::istream::ignore((long)&input_file,0x400);
        std::istream::_M_extract<double>((double *)&input_file);
        leggi_bene(&input1,"linear energy binning",buffer,&input_file);
        std::istream::ignore((long)&input_file,0x400);
        std::istream::_M_extract<double>((double *)&input_file);
        std::istream::ignore((long)&input_file,0x400);
        std::istream::_M_extract<double>((double *)&input_file);
        std::istream::ignore((long)&input_file,0x400);
        std::istream::operator>>((istream *)&input_file,&nbin_E);
        std::istream::ignore((long)&input_file,0x400);
        std::istream::_M_extract<double>((double *)&input_file);
        leggi_bene(&input1,"linear angular binning",buffer,&input_file);
        std::istream::ignore((long)&input_file,0x400);
        std::istream::_M_extract<double>((double *)&input_file);
        std::istream::ignore((long)&input_file,0x400);
        std::istream::_M_extract<double>((double *)&input_file);
        std::istream::ignore((long)&input_file,0x400);
        std::istream::operator>>((istream *)&input_file,&nbin_A);
        std::istream::ignore((long)&input_file,0x400);
        std::istream::_M_extract<double>((double *)&input_file);
        leggi_bene(&input1,"follow in a matrix",buffer,&input_file);
        uVar6 = (long)nbin_A * (long)nbin_E;
        uVar7 = (ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff;
        uVar2 = (long)uVar7 / 10;
        uVar9 = 0xffffffffffffffff;
        if (-1 < (int)uVar6) {
          uVar9 = uVar6 * 8;
        }
        pvVar4 = operator_new__(uVar9);
        do {
          std::istream::getline((char *)&input1,(long)buffer);
        } while (buffer[0] == '\0');
        local_a04 = (uint)((long)uVar7 % 10);
        uVar7 = 0;
        local_a08 = (int)uVar2;
        local_a28 = 0;
        if (0 < local_a08) {
          local_a28 = uVar2 & 0xffffffff;
        }
        for (; uVar7 != local_a28; uVar7 = uVar7 + 1) {
          std::ios::clear((int)*(undefined8 *)(_input_file + -0x18) + (int)&input_file);
          std::__cxx11::string::string((string *)local_9f0,buffer,&local_a2d);
          std::__cxx11::stringbuf::str(local_9b0);
          std::__cxx11::string::~string((string *)local_9f0);
          for (lVar8 = 0; lVar8 != 0x50; lVar8 = lVar8 + 8) {
            std::istream::_M_extract<double>((double *)&input_file);
          }
          std::istream::getline((char *)&input1,(long)buffer);
        }
        if (local_a04 != 0) {
          uVar7 = 0;
          if (0 < (int)local_a04) {
            uVar7 = (ulong)local_a04;
          }
          while (bVar11 = uVar7 != 0, uVar7 = uVar7 - 1, bVar11) {
            std::istream::_M_extract<double>((double *)&input_file);
          }
        }
        for (iVar10 = 0; iVar10 < nbin_A; iVar10 = iVar10 + 1) {
          dVar12 = E_min;
          for (lVar8 = 0; (int)lVar8 < nbin_E; lVar8 = lVar8 + 1) {
            *(undefined8 *)((long)auStack_630 + *(long *)(_output_file + -0x18)) = 7;
            puVar1 = (uint *)((long)auStack_620 + *(long *)(_output_file + -0x18));
            *puVar1 = *puVar1 | 0x100;
            poVar5 = std::ostream::_M_insert<double>(dVar12);
            std::operator<<(poVar5,"\t");
            poVar5 = std::ostream::_M_insert<double>(Delta_E + dVar12);
            std::operator<<(poVar5,"\t");
            poVar5 = std::ostream::_M_insert<double>(Theta_min);
            std::operator<<(poVar5,"\t");
            poVar5 = std::ostream::_M_insert<double>(Theta_min + Delta_theta);
            std::operator<<(poVar5,"\t");
            poVar5 = std::ostream::_M_insert<double>
                               (*(double *)
                                 ((long)pvVar4 + ((long)nbin_E * (long)iVar10 + lVar8) * 8) *
                                Delta_E * Delta_theta * weight);
            std::endl<char,std::char_traits<char>>(poVar5);
            dVar12 = dVar12 + Delta_E;
          }
          Theta_min = Delta_theta + Theta_min;
        }
        std::ifstream::close();
        std::ofstream::close();
        std::ofstream::~ofstream(&output_file);
        std::__cxx11::istringstream::~istringstream((istringstream *)&input_file);
        std::ifstream::~ifstream(&input1);
        return 0;
      }
      poVar5 = std::operator<<((ostream *)&std::cerr,"Unable to open input files");
      std::endl<char,std::char_traits<char>>(poVar5);
      exit(0xfd);
    }
    std::__cxx11::string::string((string *)buffer,argv[iVar10],local_9f0);
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            buffer,"-in");
    std::__cxx11::string::~string((string *)buffer);
    if (bVar3) {
      std::ifstream::open((char *)&input1,(_Ios_Openmode)argv[(long)iVar10 + 1]);
      bVar11 = (abStack_820[*(long *)(_input1 + -0x18)] & 5) != 0;
    }
    else {
      std::__cxx11::string::string((string *)buffer,argv[iVar10],local_9f0);
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              buffer,"-out");
      std::__cxx11::string::~string((string *)buffer);
      if (!bVar3) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Invalid argument: ");
        poVar5 = std::operator<<(poVar5,argv[iVar10]);
        std::endl<char,std::char_traits<char>>(poVar5);
        exit(0xfe);
      }
      std::ofstream::open((char *)&output_file,(_Ios_Openmode)argv[(long)iVar10 + 1]);
      local_a28._0_1_ = (abStack_618[*(long *)(_output_file + -0x18)] & 5) != 0;
    }
    iVar10 = iVar10 + 2;
  } while( true );
}

Assistant:

int main (int argc, char *argv[])
{
	if(argc < 5)
	{
		cerr << "Si usa: ./a.out  -in FILE_IN   -out FILE_OUT" << endl;
		exit(255);
	}

	ifstream input1;
	istringstream input_file;
	ofstream output_file;

	bool fallita_lettura_file_in = true, fallita_apertura_file_out = true;

	for (int i = 1; i < argc; i++)	// * We will iterate over argv[] to get the parameters stored inside.
	{								// * Note that we're starting on 1 because we don't need to know the
									// * path of the program, which is stored in argv[0]
		if (std::string(argv[i]) == "-in")
		{
			input1.open(argv[i+1]);
			fallita_lettura_file_in = input1.fail();
			i++;							// so that we skip in the for cycle the parsing of the <nome-file-particelle>
		}
		else if (std::string(argv[i]) == "-out") 
		{
			output_file.open(argv[i+1]);
			fallita_apertura_file_out = output_file.fail();
			i++;							// so that we skip in the for cycle the parsing of the <nome-file-lattice>
		}
		else
		{
			cerr << "Invalid argument: " << argv[i] << std::endl;
			exit(254);
		}
	}


	if ((fallita_lettura_file_in || fallita_apertura_file_out)) 
	{
		cerr << "Unable to open input files" << endl;
		exit(253);
	}



	char buffer[1025];
	double weight;

	leggi_bene(input1, "total weight", buffer, input_file);

	input_file.ignore(1024, ',');
	input_file.ignore(1024, 'w');
	input_file.ignore(1024, 'f');
	input_file >> weight; // letto il numero di particelle (come double!)

//	output_file << weight << endl;



	leggi_bene(input1, "linear energy binning", buffer, input_file);
	double E_min, E_max, Delta_E;
	int nbin_E;

	input_file.ignore(1024, 'm');
	input_file >> E_min;			// letta energia minima 

	input_file.ignore(1024, 'o');
	input_file >> E_max;			// letta energia massima

	input_file.ignore(1024, ',');
	input_file >> nbin_E;			// letto numero bin energia

	input_file.ignore(1024,'(');
	input_file >> Delta_E;			// letta ampiezza bins

	/**************************************
	// RE-ENABLE IF YOU WANT TO USE THE OLD usrbdx_binning TOOL - now it's included here!
	output_file << E_min << "\t" << E_max << "\t" << nbin_E << "\t" << Delta_E << endl;
	**************************************/



	leggi_bene(input1, "linear angular binning", buffer, input_file);
	double Theta_min, Theta_max, Delta_theta;
	int nbin_A;

	input_file.ignore(1024, 'm');
	input_file >> Theta_min;		// letto angolo minimo 

	input_file.ignore(1024, 'o');
	input_file >> Theta_max;		// letto angolo massimo

	input_file.ignore(1024, ',');
	input_file >> nbin_A;			// letto numero bin angolo

	input_file.ignore(1024, '(');
	input_file >> Delta_theta;		// letta ampiezza bins angolari

	/**************************************
	// RE-ENABLE IF YOU WANT TO USE THE OLD usrbdx_binning TOOL - now it's included here!
	output_file << Theta_min << "\t" << Theta_max << "\t" << nbin_A << "\t" << Delta_theta << endl;
	**************************************/
  

	leggi_bene(input1, "follow in a matrix", buffer, input_file);

	int totale_dati = nbin_E * nbin_A;
	int numero_righe = totale_dati / 10;
	int residuo_ultima_riga = totale_dati % 10;
	double *dati = new double[totale_dati];

	// saltiamo tutte le righe vuote
	do
		input1.getline(buffer, 1025);
	while(!strlen(buffer));


	for (int i = 0; i < numero_righe; i++)
	{
		input_file.clear();
		input_file.str(buffer);

		for(int k = 0; k < 10; k++)
		{
			input_file >> dati[i*10 + k];
		}

		input1.getline(buffer, 1025);
	}

	if (residuo_ultima_riga)
	{
		for (int j = 0; j < residuo_ultima_riga; j++)
		{
			input_file >> dati[numero_righe*10 + j];
		}
	}

	/**************************************
	// RE-ENABLE IF YOU WANT TO USE THE OLD usrbdx_binning TOOL - now it's included here!
	for(int k=0; k < totale_dati; k++)
	{
		cout << setprecision(4) << setiosflags(ios::scientific) << dati[k] << ' ';
		if (!((k+1) % 10)) cout << endl;
	}
	**************************************/

	double 	a_temp = E_min;

	for (int i = 0; i < nbin_A; i++)
	{
		for (int j = 0; j < nbin_E; j++)
		{
			output_file << setprecision(7) << setiosflags(ios::scientific) << a_temp << "\t" 
						<< a_temp+Delta_E << "\t" << Theta_min << "\t" << Theta_min+Delta_theta << "\t" << dati[i*nbin_E + j]*Delta_E*Delta_theta*weight << endl;
			a_temp += Delta_E;
		}
		a_temp = E_min;
		Theta_min += Delta_theta;
	}


	input1.close();
	output_file.close();
	return 0;

}